

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_frameHeaderSize_internal(void *src,size_t srcSize,ZSTD_format_e format)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  byte local_41;
  U32 fcsId;
  U32 singleSegment;
  U32 dictID;
  BYTE fhd;
  size_t minInputSize;
  ZSTD_format_e format_local;
  size_t srcSize_local;
  void *src_local;
  
  sVar3 = ZSTD_startingInputLength(format);
  if (srcSize < sVar3) {
    src_local = (void *)0xffffffffffffffb8;
  }
  else {
    bVar1 = *(byte *)((long)src + (sVar3 - 1));
    uVar2 = (int)(uint)bVar1 >> 5 & 1;
    local_41 = 0;
    if (uVar2 != 0) {
      local_41 = (int)(uint)bVar1 >> 6 != 0U ^ 0xff;
    }
    src_local = (void *)(sVar3 + (long)(int)(uint)((uVar2 != 0 ^ 0xffU) & 1) +
                         ZSTD_did_fieldSize[bVar1 & 3] +
                         ZSTD_fcs_fieldSize[(uint)((int)(uint)bVar1 >> 6)] +
                        (long)(int)(uint)(local_41 & 1));
  }
  return (size_t)src_local;
}

Assistant:

static size_t ZSTD_frameHeaderSize_internal(const void* src, size_t srcSize, ZSTD_format_e format)
{
    size_t const minInputSize = ZSTD_startingInputLength(format);
    if (srcSize < minInputSize) return ERROR(srcSize_wrong);

    {   BYTE const fhd = ((const BYTE*)src)[minInputSize-1];
        U32 const dictID= fhd & 3;
        U32 const singleSegment = (fhd >> 5) & 1;
        U32 const fcsId = fhd >> 6;
        return minInputSize + !singleSegment
             + ZSTD_did_fieldSize[dictID] + ZSTD_fcs_fieldSize[fcsId]
             + (singleSegment && !fcsId);
    }
}